

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::TableCatalogEntry::GetInfo(TableCatalogEntry *this)

{
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar1;
  pointer pCVar2;
  pointer pCVar3;
  long in_RSI;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_00;
  unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true> local_b0;
  __uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> local_a8;
  ColumnList local_a0;
  
  local_a8._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)this;
  make_uniq<duckdb::CreateTableInfo>();
  Catalog::GetName_abi_cxx11_(*(Catalog **)(in_RSI + 0xd8));
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateInfo).catalog);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateInfo).schema);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar2->table);
  ColumnList::Copy(&local_a0,(ColumnList *)(in_RSI + 0x120));
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ColumnList::operator=(&pCVar2->columns,&local_a0);
  ColumnList::~ColumnList(&local_a0);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ::reserve(&(pCVar2->constraints).
             super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ,*(long *)(in_RSI + 0x198) - *(long *)(in_RSI + 400) >> 3);
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&(pCVar2->super_CreateInfo).dependencies,
              (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(in_RSI + 0xe8));
  puVar1 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
            (in_RSI + 0x198);
  for (this_00 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
                  (in_RSI + 400); this_00 != puVar1; this_00 = this_00 + 1) {
    pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->(&local_b0);
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_00);
    (*pCVar3->_vptr_Constraint[3])(&local_a0,pCVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar2->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &local_a0);
    if (local_a0.columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_a0.columns.
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 8))();
    }
  }
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  Value::operator=(&(pCVar2->super_CreateInfo).comment,(Value *)(in_RSI + 0x50));
  pCVar2 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->(&local_b0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar2->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(in_RSI + 0x90));
  *(unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_> *)
   local_a8._M_t.
   super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
   super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       local_b0.
       super_unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateTableInfo_*,_std::default_delete<duckdb::CreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::CreateTableInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         local_a8._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> TableCatalogEntry::GetInfo() const {
	auto result = make_uniq<CreateTableInfo>();
	result->catalog = catalog.GetName();
	result->schema = schema.name;
	result->table = name;
	result->columns = columns.Copy();
	result->constraints.reserve(constraints.size());
	result->dependencies = dependencies;
	std::for_each(constraints.begin(), constraints.end(),
	              [&result](const unique_ptr<Constraint> &c) { result->constraints.emplace_back(c->Copy()); });
	result->comment = comment;
	result->tags = tags;
	return std::move(result);
}